

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O1

bool __thiscall
cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag
          (cmLinkLineDeviceComputer *this,cmComputeLinkInformation *cli)

{
  pointer pcVar1;
  Item *pIVar2;
  uint uVar3;
  bool bVar4;
  ItemVector *pIVar5;
  __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
  __it;
  long lVar6;
  __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
  _Var7;
  string config;
  uint *local_110;
  long local_108;
  undefined8 local_100;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  uint *local_f0;
  long local_e8;
  uint local_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  uint *local_d0;
  long local_c8;
  long local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  long *local_90;
  long local_88;
  long local_80 [2];
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  pIVar5 = cmComputeLinkInformation::GetItems(cli);
  local_50 = local_40;
  pcVar1 = (cli->Config)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (cli->Config)._M_string_length);
  __it._M_current =
       (pIVar5->
       super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
       )._M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (pIVar5->
           super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_50,local_48 + (long)local_50);
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_b0,local_a8 + (long)local_b0);
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_90,local_88 + (long)local_90);
  local_f0 = &local_e0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f0,local_70,local_68 + (long)local_70);
  uVar3 = local_e0;
  local_c8 = local_e8;
  if (local_f0 == &local_e0) {
    uStack_f8 = uStack_d8;
    uStack_f4 = uStack_d4;
    local_110 = (uint *)&local_100;
  }
  else {
    local_110 = local_f0;
  }
  local_100 = CONCAT44(uStack_dc,local_e0);
  local_108 = local_e8;
  local_e8 = 0;
  local_e0 = local_e0 & 0xffffff00;
  local_d0 = (uint *)&local_c0;
  if (local_110 == (uint *)&local_100) {
    local_c0 = CONCAT44(uStack_dc,uVar3);
    uStack_b8 = uStack_f8;
    uStack_b4 = uStack_f4;
  }
  else {
    local_d0 = local_110;
    local_c0 = local_100;
  }
  local_110 = (uint *)&local_100;
  local_f0 = &local_e0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_110,local_d0,local_c8 + (long)local_d0)
  ;
  lVar6 = ((long)pIVar2 - (long)__it._M_current >> 4) * -0x3333333333333333 >> 2;
  if (0 < lVar6) {
    lVar6 = lVar6 + 1;
    do {
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::$_0>
              ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::__0>
                            *)&local_110,__it);
      _Var7._M_current = __it._M_current;
      if (bVar4) goto LAB_0056d19c;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::$_0>
              ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::__0>
                            *)&local_110,__it._M_current + 1);
      _Var7._M_current = __it._M_current + 1;
      if (bVar4) goto LAB_0056d19c;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::$_0>
              ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::__0>
                            *)&local_110,__it._M_current + 2);
      _Var7._M_current = __it._M_current + 2;
      if (bVar4) goto LAB_0056d19c;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::$_0>
              ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::__0>
                            *)&local_110,__it._M_current + 3);
      _Var7._M_current = __it._M_current + 3;
      if (bVar4) goto LAB_0056d19c;
      __it._M_current = __it._M_current + 4;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
  }
  lVar6 = ((long)pIVar2 - (long)__it._M_current >> 4) * -0x3333333333333333;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      _Var7._M_current = pIVar2;
      if ((lVar6 != 3) ||
         (bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::$_0>
                  ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::__0>
                                *)&local_110,__it), _Var7._M_current = __it._M_current, bVar4))
      goto LAB_0056d19c;
      __it._M_current = __it._M_current + 1;
    }
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::$_0>
            ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::__0>
                          *)&local_110,__it);
    _Var7._M_current = __it._M_current;
    if (bVar4) goto LAB_0056d19c;
    __it._M_current = __it._M_current + 1;
  }
  bVar4 = __gnu_cxx::__ops::
          _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::$_0>
          ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::__0>
                        *)&local_110,__it);
  _Var7._M_current = __it._M_current;
  if (!bVar4) {
    _Var7._M_current = pIVar2;
  }
LAB_0056d19c:
  if (local_110 != (uint *)&local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_d0 != (uint *)&local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,CONCAT44(uStack_dc,local_e0) + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return _Var7._M_current != pIVar2;
}

Assistant:

bool cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(
  cmComputeLinkInformation& cli)
{
  // Determine if this item might requires device linking.
  // For this we only consider targets
  using ItemVector = cmComputeLinkInformation::ItemVector;
  ItemVector const& items = cli.GetItems();
  std::string config = cli.GetConfig();
  return std::any_of(
    items.begin(), items.end(),
    [config](cmComputeLinkInformation::Item const& item) -> bool {
      return item.Target &&
        item.Target->GetType() == cmStateEnums::STATIC_LIBRARY &&
        // this dependency requires us to device link it
        !item.Target->GetPropertyAsBool("CUDA_RESOLVE_DEVICE_SYMBOLS") &&
        item.Target->GetPropertyAsBool("CUDA_SEPARABLE_COMPILATION") &&
        item.Target->IsIPOEnabled("CUDA", config);
    });
}